

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_multi_closed(connectdata *conn,curl_socket_t s)

{
  Curl_multi *pCVar1;
  void *pvVar2;
  Curl_sh_entry *entry;
  Curl_multi *multi;
  connectdata *pcStack_10;
  curl_socket_t s_local;
  connectdata *conn_local;
  
  pCVar1 = conn->data->multi;
  if ((pCVar1 != (Curl_multi *)0x0) &&
     (multi._4_4_ = s, pcStack_10 = conn,
     pvVar2 = Curl_hash_pick(&pCVar1->sockhash,(void *)((long)&multi + 4),4), pvVar2 != (void *)0x0)
     ) {
    if (pCVar1->socket_cb != (curl_socket_callback)0x0) {
      (*pCVar1->socket_cb)
                (pcStack_10->data,multi._4_4_,4,pCVar1->socket_userp,*(void **)((long)pvVar2 + 0x10)
                );
    }
    sh_delentry(&pCVar1->sockhash,multi._4_4_);
  }
  return;
}

Assistant:

void Curl_multi_closed(struct connectdata *conn, curl_socket_t s)
{
  struct Curl_multi *multi = conn->data->multi;
  if(multi) {
    /* this is set if this connection is part of a handle that is added to
       a multi handle, and only then this is necessary */
    struct Curl_sh_entry *entry =
      Curl_hash_pick(&multi->sockhash, (char *)&s, sizeof(s));

    if(entry) {
      if(multi->socket_cb)
        multi->socket_cb(conn->data, s, CURL_POLL_REMOVE,
                         multi->socket_userp,
                         entry->socketp);

      /* now remove it from the socket hash */
      sh_delentry(&multi->sockhash, s);
    }
  }
}